

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uInput.cpp
# Opt level: O1

void __thiscall uInputPlus::uInput::__init(uInput *this,uInputSetup *setup)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  pointer puVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  system_error *this_00;
  int *piVar7;
  error_category *peVar8;
  _Rb_tree_header *p_Var9;
  pointer puVar10;
  
  iVar4 = open("/dev/uinput",0x801);
  this->fd_ = iVar4;
  if (iVar4 < 0) {
    this_00 = (system_error *)__cxa_allocate_exception(0x20);
    piVar7 = __errno_location();
    iVar4 = *piVar7;
    peVar8 = (error_category *)std::_V2::system_category();
    std::system_error::system_error(this_00,iVar4,peVar8,"failed to open uinput device");
  }
  else {
    p_Var1 = &(setup->Events)._M_t._M_impl.super__Rb_tree_header;
    for (p_Var5 = (setup->Events)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != p_Var1;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      iVar4 = ioctl(this->fd_,0x40045564,(ulong)p_Var5[1]._M_color);
      if (iVar4 != 0) {
        this_00 = (system_error *)__cxa_allocate_exception(0x20);
        piVar7 = __errno_location();
        iVar4 = *piVar7;
        peVar8 = (error_category *)std::_V2::system_category();
        std::system_error::system_error(this_00,iVar4,peVar8,"UI_SET_EVBIT ioctl failed");
        goto LAB_00104355;
      }
    }
    p_Var2 = (setup->Events)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = &p_Var1->_M_header;
    for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
        p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < 1]) {
      if (0 < (int)*(size_t *)(p_Var2 + 1)) {
        p_Var6 = p_Var2;
      }
    }
    p_Var9 = p_Var1;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
       (p_Var9 = (_Rb_tree_header *)p_Var6, 1 < (int)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
      p_Var9 = p_Var1;
    }
    if (p_Var9 != p_Var1) {
      for (p_Var5 = (setup->Keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &(setup->Keys)._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        iVar4 = ioctl(this->fd_,0x40045565,(ulong)p_Var5[1]._M_color);
        if (iVar4 != 0) {
          this_00 = (system_error *)__cxa_allocate_exception(0x20);
          piVar7 = __errno_location();
          iVar4 = *piVar7;
          peVar8 = (error_category *)std::_V2::system_category();
          std::system_error::system_error(this_00,iVar4,peVar8,"UI_SET_EVBIT ioctl failed");
          goto LAB_00104355;
        }
      }
    }
    p_Var2 = (setup->Events)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = &p_Var1->_M_header;
    for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
        p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < 2]) {
      if (1 < (int)*(size_t *)(p_Var2 + 1)) {
        p_Var6 = p_Var2;
      }
    }
    p_Var9 = p_Var1;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
       (p_Var9 = (_Rb_tree_header *)p_Var6, 2 < (int)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
      p_Var9 = p_Var1;
    }
    if (p_Var9 != p_Var1) {
      for (p_Var5 = (setup->Rels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &(setup->Rels)._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        iVar4 = ioctl(this->fd_,0x40045566,(ulong)p_Var5[1]._M_color);
        if (iVar4 != 0) {
          this_00 = (system_error *)__cxa_allocate_exception(0x20);
          piVar7 = __errno_location();
          iVar4 = *piVar7;
          peVar8 = (error_category *)std::_V2::system_category();
          std::system_error::system_error(this_00,iVar4,peVar8,"UI_SET_RELBIT ioctl failed");
          goto LAB_00104355;
        }
      }
    }
    p_Var2 = (setup->Events)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = &p_Var1->_M_header;
    for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
        p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < 3]) {
      if (2 < (int)*(size_t *)(p_Var2 + 1)) {
        p_Var6 = p_Var2;
      }
    }
    p_Var9 = p_Var1;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
       (p_Var9 = (_Rb_tree_header *)p_Var6, 3 < (int)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
      p_Var9 = p_Var1;
    }
    if (p_Var9 != p_Var1) {
      puVar3 = (setup->AbsSetup).
               super__Vector_base<uInputPlus::uInputAbsSetup,_std::allocator<uInputPlus::uInputAbsSetup>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar10 = (setup->AbsSetup).
                     super__Vector_base<uInputPlus::uInputAbsSetup,_std::allocator<uInputPlus::uInputAbsSetup>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar3;
          puVar10 = puVar10 + 1) {
        iVar4 = ioctl(this->fd_,0x40045567,(ulong)*puVar10->Code);
        if (iVar4 != 0) {
          this_00 = (system_error *)__cxa_allocate_exception(0x20);
          piVar7 = __errno_location();
          iVar4 = *piVar7;
          peVar8 = (error_category *)std::_V2::system_category();
          std::system_error::system_error(this_00,iVar4,peVar8,"UI_SET_ABSBIT ioctl failed");
          goto LAB_00104355;
        }
        iVar4 = ioctl(this->fd_,0x401c5504,puVar10);
        if (iVar4 != 0) {
          this_00 = (system_error *)__cxa_allocate_exception(0x20);
          piVar7 = __errno_location();
          iVar4 = *piVar7;
          peVar8 = (error_category *)std::_V2::system_category();
          std::system_error::system_error(this_00,iVar4,peVar8,"UI_ABS_SETUP ioctl failed");
          goto LAB_00104355;
        }
      }
    }
    for (p_Var5 = (setup->Props)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(setup->Props)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      iVar4 = ioctl(this->fd_,0x4004556e,(ulong)p_Var5[1]._M_color);
      if (iVar4 != 0) {
        this_00 = (system_error *)__cxa_allocate_exception(0x20);
        piVar7 = __errno_location();
        iVar4 = *piVar7;
        peVar8 = (error_category *)std::_V2::system_category();
        std::system_error::system_error(this_00,iVar4,peVar8,"UI_SET_PROPBIT ioctl failed");
        goto LAB_00104355;
      }
    }
    iVar4 = ioctl(this->fd_,0x405c5503,setup);
    if (iVar4 == 0) {
      iVar4 = ioctl(this->fd_,0x5501);
      if (iVar4 == 0) {
        return;
      }
      this_00 = (system_error *)__cxa_allocate_exception(0x20);
      piVar7 = __errno_location();
      iVar4 = *piVar7;
      peVar8 = (error_category *)std::_V2::system_category();
      std::system_error::system_error(this_00,iVar4,peVar8,"UI_DEV_CREATE ioctl failed");
    }
    else {
      this_00 = (system_error *)__cxa_allocate_exception(0x20);
      piVar7 = __errno_location();
      iVar4 = *piVar7;
      peVar8 = (error_category *)std::_V2::system_category();
      std::system_error::system_error(this_00,iVar4,peVar8,"UI_DEV_SETUP ioctl failed");
    }
  }
LAB_00104355:
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void uInput::__init(const uInputSetup &setup) {
	fd_ = open("/dev/uinput", O_WRONLY | O_NONBLOCK);

	if (fd_ < 0)
		throw std::system_error(errno, std::system_category(), "failed to open uinput device");

	for (auto it : setup.Events) {
		if (ioctl(fd_, UI_SET_EVBIT, it))
			throw std::system_error(errno, std::system_category(), "UI_SET_EVBIT ioctl failed");
	}

	if (setup.Events.find(EV_KEY) != setup.Events.end()) {
		for (auto it : setup.Keys) {
			if (ioctl(fd_, UI_SET_KEYBIT, it))
				throw std::system_error(errno, std::system_category(), "UI_SET_EVBIT ioctl failed");
		}
	}

	if (setup.Events.find(EV_REL) != setup.Events.end()) {
		for (auto it : setup.Rels) {
			if (ioctl(fd_, UI_SET_RELBIT, it))
				throw std::system_error(errno, std::system_category(), "UI_SET_RELBIT ioctl failed");
		}
	}


//	uinput_abs_setup s1, s2, s3, s4;
//
//	memset(&s1, 0, sizeof(uinput_abs_setup));
//	memset(&s2, 0, sizeof(uinput_abs_setup));
//	memset(&s3, 0, sizeof(uinput_abs_setup));
//	memset(&s4, 0, sizeof(uinput_abs_setup));
//
//	s1.code = ABS_MT_POSITION_X;
//	s2.code = ABS_MT_POSITION_Y;
//	s3.code = ABS_MT_SLOT;
//	s4.code = ABS_MT_TRACKING_ID;
//
//	s1.absinfo.maximum = s2.absinfo.maximum = 4000;
//	s3.absinfo.maximum = 5;
//	s4.absinfo.maximum = 65535;
//
//	ioctl(FD, UI_ABS_SETUP, &s1);
//	ioctl(FD, UI_ABS_SETUP, &s2);
//	ioctl(FD, UI_ABS_SETUP, &s3);
//	ioctl(FD, UI_ABS_SETUP, &s4);


	if (setup.Events.find(EV_ABS) != setup.Events.end()) {

		for (auto &it : setup.AbsSetup) {
			if (ioctl(fd_, UI_SET_ABSBIT, it.Code))
				throw std::system_error(errno, std::system_category(), "UI_SET_ABSBIT ioctl failed");

			if (ioctl(fd_, UI_ABS_SETUP, &(it.setup)))
				throw std::system_error(errno, std::system_category(), "UI_ABS_SETUP ioctl failed");
		}
	}

	for (auto &it : setup.Props) {
		if (ioctl(fd_, UI_SET_PROPBIT, it))
			throw std::system_error(errno, std::system_category(), "UI_SET_PROPBIT ioctl failed");
	}

	if (ioctl(fd_, UI_DEV_SETUP, &(setup.DeviceInfo.usetup)))
		throw std::system_error(errno, std::system_category(), "UI_DEV_SETUP ioctl failed");

	if (ioctl(fd_, UI_DEV_CREATE))
		throw std::system_error(errno, std::system_category(), "UI_DEV_CREATE ioctl failed");

}